

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar inputByte)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"  ","");
  uVar5 = 1;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if (__return_storage_ptr__->_M_string_length <= uVar5) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar3 = inputByte & 0xf;
    cVar4 = bVar3 + 0x57;
    if (bVar3 < 10) {
      cVar4 = bVar3 + 0x30;
    }
    inputByte = inputByte >> 4;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = cVar4;
    uVar5 = 0;
    bVar1 = false;
  } while (bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char inputByte) const
{
  std::string result("  ");
  for (int i = 0; i < 2; ++i) {
    unsigned char rest = inputByte % 16;
    inputByte /= 16;
    char c = (rest < 0xA) ? static_cast<char>('0' + rest)
                          : static_cast<char>('a' + (rest - 0xA));
    result.at(1 - i) = c;
  }

  return result;
}